

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.h
# Opt level: O2

void __thiscall
Iir::PoleFilter<Iir::ChebyshevII::BandPassBase,_Iir::DirectFormII,_3,_6>::PoleFilter
          (PoleFilter<Iir::ChebyshevII::BandPassBase,_Iir::DirectFormII,_3,_6> *this)

{
  CascadeStages<3,_Iir::DirectFormII> *this_00;
  Storage local_30;
  
  PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>::PoleFilterBase
            ((PoleFilterBase<Iir::ChebyshevII::AnalogLowPass> *)this);
  this_00 = &this->super_CascadeStages<3,_Iir::DirectFormII>;
  CascadeStages<3,_Iir::DirectFormII>::CascadeStages(this_00);
  memset(&this->m_analogStorage,0,0x140);
  Layout<6>::Layout(&this->m_digitalStorage);
  local_30.maxStages = 3;
  local_30.stageArray = this_00->m_stages;
  Cascade::setCascadeStorage((Cascade *)this,&local_30);
  (this->super_BandPassBase).super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_numPoles = 0;
  (this->super_BandPassBase).super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_maxPoles = 3;
  (this->super_BandPassBase).super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>.m_analogProto.
  super_LayoutBase.m_pair = (this->m_analogStorage).m_pairs;
  (this->super_BandPassBase).super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_numPoles = 0;
  (this->super_BandPassBase).super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_maxPoles = 6;
  (this->super_BandPassBase).super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>.
  super_PoleFilterBase2.m_digitalProto.m_pair = (this->m_digitalStorage).m_pairs;
  *(undefined4 *)
   &(this->super_BandPassBase).super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>.
    super_PoleFilterBase2.m_digitalProto.m_normalW = 0;
  *(undefined4 *)
   ((long)&(this->super_BandPassBase).super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>.
           super_PoleFilterBase2.m_digitalProto.m_normalW + 4) = 0;
  *(undefined4 *)
   &(this->super_BandPassBase).super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>.
    super_PoleFilterBase2.m_digitalProto.m_normalGain = 0;
  *(undefined4 *)
   ((long)&(this->super_BandPassBase).super_PoleFilterBase<Iir::ChebyshevII::AnalogLowPass>.
           super_PoleFilterBase2.m_digitalProto.m_normalGain + 4) = 0x3ff00000;
  CascadeStages<3,_Iir::DirectFormII>::reset(this_00);
  return;
}

Assistant:

PoleFilter ()
			{
				// This glues together the factored base classes
				// with the templatized storage classes.
				BaseClass::setCascadeStorage (this->getCascadeStorage());
				BaseClass::setPrototypeStorage (m_analogStorage, m_digitalStorage);
				CascadeStages<(MaxDigitalPoles + 1) / 2 , StateType>::reset();
			}